

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2DArray_GL.cpp
# Opt level: O3

void __thiscall
Diligent::Texture2DArray_GL::AttachToFramebuffer
          (Texture2DArray_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  undefined4 in_register_0000000c;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  if ((ViewDesc->field_6).NumArraySlices == 1) {
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
        FormatString<char[26],char[99]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])CONCAT44(in_register_0000000c,Targets));
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
                   ,0x10b);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      (*__glewFramebufferTextureLayer)
                (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
                 ViewDesc->MostDetailedMip,(ViewDesc->field_5).FirstArraySlice);
      local_54 = glGetError();
      if (local_54 != 0) {
        LogError<false,char[54],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
                   ,0x10d,(char (*) [54])"Failed to attach texture 2D array to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&local_54);
        FormatString<char[6]>(&local_50,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
                   ,0x10d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) == FRAMEBUFFER_TARGET_FLAG_NONE) {
      return;
    }
    (*__glewFramebufferTextureLayer)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
               ViewDesc->MostDetailedMip,(ViewDesc->field_5).FirstArraySlice);
    local_54 = glGetError();
    if (local_54 == 0) {
      return;
    }
    LogError<false,char[54],char[17],unsigned_int>
              (false,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
               ,0x112,(char (*) [54])"Failed to attach texture 2D array to read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
               ,0x112);
  }
  else if ((ViewDesc->field_6).NumArraySlices ==
           (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           .m_Desc.field_3.ArraySize) {
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
        FormatString<char[26],char[99]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])CONCAT44(in_register_0000000c,Targets));
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
                   ,0x11b);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      (*__glewFramebufferTexture)
                (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
                 ViewDesc->MostDetailedMip);
      local_54 = glGetError();
      if (local_54 != 0) {
        LogError<false,char[54],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
                   ,0x11d,(char (*) [54])"Failed to attach texture 2D array to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&local_54);
        FormatString<char[6]>(&local_50,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
                   ,0x11d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) == FRAMEBUFFER_TARGET_FLAG_NONE) {
      return;
    }
    (*__glewFramebufferTexture)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
               ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 == 0) {
      return;
    }
    LogError<false,char[54],char[17],unsigned_int>
              (false,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
               ,0x122,(char (*) [54])"Failed to attach texture 2D array to read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
               ,0x122);
  }
  else {
    FormatString<char[76]>
              (&local_50,
               (char (*) [76])
               "Only one slice or the entire texture array can be attached to a framebuffer");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2DArray_GL.cpp"
               ,0x127);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Texture2DArray_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    if (ViewDesc.NumArraySlices == 1)
    {
        // Texture name must either be zero or the name of an existing 3D texture, 1D or 2D array texture,
        // cube map array texture, or multisample array texture.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip, ViewDesc.FirstArraySlice);
            DEV_CHECK_GL_ERROR("Failed to attach texture 2D array to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTextureLayer(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip, ViewDesc.FirstArraySlice);
            DEV_CHECK_GL_ERROR("Failed to attach texture 2D array to read framebuffer");
        }
    }
    else if (ViewDesc.NumArraySlices == m_Desc.ArraySize)
    {
        // NOTE: there is no glFramebufferTexture in WebGL, so we must use glFramebufferTextureLayer for single-slice array textures.

        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture 2D array to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture 2D array to read framebuffer");
        }
    }
    else
    {
        UNEXPECTED("Only one slice or the entire texture array can be attached to a framebuffer");
    }
}